

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetNullCompositeConstant(ConstantManager *this,Type *type)

{
  uint uVar1;
  long lVar2;
  Vector *pVVar3;
  Matrix *pMVar4;
  Array *pAVar5;
  LengthInfo *pLVar6;
  const_reference pvVar7;
  uint local_7c;
  uint32_t i_2;
  uint32_t element_count_2;
  uint32_t null_id_2;
  Type *element_type_2;
  uint local_60;
  uint32_t i_1;
  uint32_t element_count_1;
  uint32_t null_id_1;
  Type *element_type_1;
  uint local_48;
  uint32_t i;
  uint32_t element_count;
  uint32_t null_id;
  Type *element_type;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literal_words_or_id;
  Type *type_local;
  ConstantManager *this_local;
  
  literal_words_or_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)type;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&element_type);
  lVar2 = (**(code **)(*(long *)literal_words_or_id.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 0x70))();
  if (lVar2 == 0) {
    lVar2 = (**(code **)(*(long *)literal_words_or_id.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 0x80))();
    if (lVar2 == 0) {
      lVar2 = (**(code **)(*(long *)literal_words_or_id.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe0))();
      if (lVar2 != 0) {
        this_local = (ConstantManager *)0x0;
        goto LAB_00308ca4;
      }
      lVar2 = (**(code **)(*(long *)literal_words_or_id.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 0xc0))();
      if (lVar2 == 0) {
        this_local = (ConstantManager *)0x0;
        goto LAB_00308ca4;
      }
      pAVar5 = (Array *)(**(code **)(*(long *)literal_words_or_id.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                    0xc0))();
      _element_count_2 = Array::element_type(pAVar5);
      i_2 = GetNullConstId(this,_element_count_2);
      pAVar5 = (Array *)(**(code **)(*(long *)literal_words_or_id.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                    0xc0))();
      pLVar6 = Array::length_info(pAVar5);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&pLVar6->words,0);
      if (*pvVar7 != 0) {
        __assert_fail("type->AsArray()->length_info().words[0] == analysis::Array::LengthInfo::kConstant && \"unexpected array length\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                      ,0x1a2,
                      "const Constant *spvtools::opt::analysis::ConstantManager::GetNullCompositeConstant(const Type *)"
                     );
      }
      pAVar5 = (Array *)(**(code **)(*(long *)literal_words_or_id.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                    0xc0))();
      pLVar6 = Array::length_info(pAVar5);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&pLVar6->words,0);
      uVar1 = *pvVar7;
      for (local_7c = 0; local_7c < uVar1; local_7c = local_7c + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&element_type,&i_2);
      }
    }
    else {
      pMVar4 = (Matrix *)
               (**(code **)(*(long *)literal_words_or_id.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x80))();
      _element_count_1 = Matrix::element_type(pMVar4);
      i_1 = GetNullConstId(this,_element_count_1);
      pMVar4 = (Matrix *)
               (**(code **)(*(long *)literal_words_or_id.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x80))();
      local_60 = Matrix::element_count(pMVar4);
      for (element_type_2._4_4_ = 0; element_type_2._4_4_ < local_60;
          element_type_2._4_4_ = element_type_2._4_4_ + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&element_type,&i_1);
      }
    }
  }
  else {
    pVVar3 = (Vector *)
             (**(code **)(*(long *)literal_words_or_id.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x70))();
    _element_count = Vector::element_type(pVVar3);
    i = GetNullConstId(this,_element_count);
    pVVar3 = (Vector *)
             (**(code **)(*(long *)literal_words_or_id.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x70))();
    local_48 = Vector::element_count(pVVar3);
    for (element_type_1._4_4_ = 0; element_type_1._4_4_ < local_48;
        element_type_1._4_4_ = element_type_1._4_4_ + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&element_type,&i);
    }
  }
  this_local = (ConstantManager *)
               GetConstant(this,(Type *)literal_words_or_id.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&element_type);
LAB_00308ca4:
  element_type_2._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&element_type);
  return (Constant *)this_local;
}

Assistant:

const Constant* ConstantManager::GetNullCompositeConstant(const Type* type) {
  std::vector<uint32_t> literal_words_or_id;

  if (type->AsVector()) {
    const Type* element_type = type->AsVector()->element_type();
    const uint32_t null_id = GetNullConstId(element_type);
    const uint32_t element_count = type->AsVector()->element_count();
    for (uint32_t i = 0; i < element_count; i++) {
      literal_words_or_id.push_back(null_id);
    }
  } else if (type->AsMatrix()) {
    const Type* element_type = type->AsMatrix()->element_type();
    const uint32_t null_id = GetNullConstId(element_type);
    const uint32_t element_count = type->AsMatrix()->element_count();
    for (uint32_t i = 0; i < element_count; i++) {
      literal_words_or_id.push_back(null_id);
    }
  } else if (type->AsStruct()) {
    // TODO (sfricke-lunarg) add proper struct support
    return nullptr;
  } else if (type->AsArray()) {
    const Type* element_type = type->AsArray()->element_type();
    const uint32_t null_id = GetNullConstId(element_type);
    assert(type->AsArray()->length_info().words[0] ==
               analysis::Array::LengthInfo::kConstant &&
           "unexpected array length");
    const uint32_t element_count = type->AsArray()->length_info().words[0];
    for (uint32_t i = 0; i < element_count; i++) {
      literal_words_or_id.push_back(null_id);
    }
  } else {
    return nullptr;
  }

  return GetConstant(type, literal_words_or_id);
}